

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O2

void enet_peer_dispatch_incoming_unreliable_commands
               (ENetPeer *peer,ENetChannel *channel,ENetIncomingCommand *queuedCommand)

{
  ENetList *excludeCommand;
  ENetList *pEVar1;
  ushort uVar2;
  ushort uVar3;
  _ENetListNode *p_Var4;
  _ENetListNode *p_Var5;
  _ENetHost *p_Var6;
  _ENetListNode *p_Var7;
  ENetListIterator last;
  _ENetListNode *p_Var8;
  ENetIncomingCommand *incomingCommand;
  _ENetListNode *p_Var9;
  ENetListIterator first;
  ENetListIterator pEVar10;
  ENetListIterator last_1;
  ushort uVar11;
  
  excludeCommand = &channel->incomingUnreliableCommands;
  pEVar1 = &peer->dispatchedCommands;
  p_Var8 = (channel->incomingUnreliableCommands).sentinel.next;
  pEVar10 = p_Var8;
  for (p_Var9 = p_Var8; p_Var9 != &excludeCommand->sentinel; p_Var9 = p_Var9->next) {
    if (((ulong)p_Var9[1].next & 0xf00000000) != 0x900000000) {
      uVar2 = *(ushort *)&p_Var9[1].next;
      uVar3 = channel->incomingReliableSequenceNumber;
      if (uVar2 == uVar3) {
        if (*(int *)&p_Var9[4].previous == 0) {
          channel->incomingUnreliableSequenceNumber = *(uint16_t *)((long)&p_Var9[1].next + 2);
          goto LAB_001060bc;
        }
        if (pEVar10 == p_Var9) {
          if (p_Var8 != p_Var9) {
            p_Var8 = p_Var9->previous;
          }
        }
        else {
          p_Var8 = p_Var9->previous;
          p_Var4 = p_Var8->next;
          p_Var5 = pEVar10->previous;
          p_Var5->next = p_Var4;
          p_Var4->previous = p_Var5;
          p_Var4 = (peer->dispatchedCommands).sentinel.previous;
          pEVar10->previous = p_Var4;
          p_Var8->next = &pEVar1->sentinel;
          p_Var4->next = pEVar10;
          (peer->dispatchedCommands).sentinel.previous = p_Var8;
          p_Var8 = p_Var9;
          if (peer->needsDispatch == 0) {
            p_Var6 = peer->host;
            p_Var8 = (p_Var6->dispatchQueue).sentinel.previous;
            (peer->dispatchList).previous = p_Var8;
            (peer->dispatchList).next = &(p_Var6->dispatchQueue).sentinel;
            p_Var8->next = &peer->dispatchList;
            (p_Var6->dispatchQueue).sentinel.previous = &peer->dispatchList;
            peer->needsDispatch = 1;
            p_Var8 = p_Var9;
          }
        }
      }
      else {
        uVar11 = (uVar2 >> 0xc) + 0x10;
        if (uVar3 <= uVar2) {
          uVar11 = uVar2 >> 0xc;
        }
        if (uVar3 >> 0xc <= uVar11 && uVar11 < (ushort)((uVar3 >> 0xc) + 7)) break;
        p_Var8 = p_Var9->next;
        if (pEVar10 != p_Var9) {
          p_Var4 = p_Var9->previous;
          p_Var5 = p_Var4->next;
          p_Var7 = pEVar10->previous;
          p_Var7->next = p_Var5;
          p_Var5->previous = p_Var7;
          p_Var5 = (peer->dispatchedCommands).sentinel.previous;
          pEVar10->previous = p_Var5;
          p_Var4->next = &pEVar1->sentinel;
          p_Var5->next = pEVar10;
          (peer->dispatchedCommands).sentinel.previous = p_Var4;
          if (peer->needsDispatch == 0) {
            p_Var6 = peer->host;
            p_Var4 = (p_Var6->dispatchQueue).sentinel.previous;
            (peer->dispatchList).previous = p_Var4;
            (peer->dispatchList).next = &(p_Var6->dispatchQueue).sentinel;
            p_Var4->next = &peer->dispatchList;
            (p_Var6->dispatchQueue).sentinel.previous = &peer->dispatchList;
            peer->needsDispatch = 1;
          }
        }
      }
      pEVar10 = p_Var9->next;
    }
LAB_001060bc:
  }
  if (pEVar10 != p_Var9) {
    p_Var8 = p_Var9->previous;
    p_Var4 = p_Var8->next;
    p_Var5 = pEVar10->previous;
    p_Var5->next = p_Var4;
    p_Var4->previous = p_Var5;
    p_Var4 = (peer->dispatchedCommands).sentinel.previous;
    pEVar10->previous = p_Var4;
    p_Var8->next = &pEVar1->sentinel;
    p_Var4->next = pEVar10;
    (peer->dispatchedCommands).sentinel.previous = p_Var8;
    p_Var8 = p_Var9;
    if (peer->needsDispatch == 0) {
      p_Var6 = peer->host;
      p_Var8 = (p_Var6->dispatchQueue).sentinel.previous;
      (peer->dispatchList).previous = p_Var8;
      (peer->dispatchList).next = &(p_Var6->dispatchQueue).sentinel;
      p_Var8->next = &peer->dispatchList;
      (p_Var6->dispatchQueue).sentinel.previous = &peer->dispatchList;
      peer->needsDispatch = 1;
      p_Var8 = p_Var9;
    }
  }
  enet_peer_remove_incoming_commands
            ((ENetList *)(excludeCommand->sentinel).next,p_Var8,&queuedCommand->incomingCommandList,
             (ENetIncomingCommand *)excludeCommand);
  return;
}

Assistant:

void enet_peer_dispatch_incoming_unreliable_commands(ENetPeer* peer, ENetChannel* channel, ENetIncomingCommand* queuedCommand) {
	ENetListIterator droppedCommand, startCommand, currentCommand;

	for (droppedCommand = startCommand = currentCommand = enet_list_begin(&channel->incomingUnreliableCommands); currentCommand != enet_list_end(&channel->incomingUnreliableCommands); currentCommand = enet_list_next(currentCommand)) {
		ENetIncomingCommand* incomingCommand = (ENetIncomingCommand*)currentCommand;

		if ((incomingCommand->command.header.command & ENET_PROTOCOL_COMMAND_MASK) == ENET_PROTOCOL_COMMAND_SEND_UNSEQUENCED)
			continue;

		if (incomingCommand->reliableSequenceNumber == channel->incomingReliableSequenceNumber) {
			if (incomingCommand->fragmentsRemaining <= 0) {
				channel->incomingUnreliableSequenceNumber = incomingCommand->unreliableSequenceNumber;

				continue;
			}

			if (startCommand != currentCommand) {
				enet_list_move(enet_list_end(&peer->dispatchedCommands), startCommand, enet_list_previous(currentCommand));

				if (!peer->needsDispatch) {
					enet_list_insert(enet_list_end(&peer->host->dispatchQueue), &peer->dispatchList);

					peer->needsDispatch = 1;
				}

				droppedCommand = currentCommand;
			}
			else if (droppedCommand != currentCommand) {
				droppedCommand = enet_list_previous(currentCommand);
			}
		}
		else {
			uint16_t reliableWindow = incomingCommand->reliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;
			uint16_t currentWindow = channel->incomingReliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;

			if (incomingCommand->reliableSequenceNumber < channel->incomingReliableSequenceNumber)
				reliableWindow += ENET_PEER_RELIABLE_WINDOWS;

			if (reliableWindow >= currentWindow && reliableWindow < currentWindow + ENET_PEER_FREE_RELIABLE_WINDOWS - 1)
				break;

			droppedCommand = enet_list_next(currentCommand);

			if (startCommand != currentCommand) {
				enet_list_move(enet_list_end(&peer->dispatchedCommands), startCommand, enet_list_previous(currentCommand));

				if (!peer->needsDispatch) {
					enet_list_insert(enet_list_end(&peer->host->dispatchQueue), &peer->dispatchList);

					peer->needsDispatch = 1;
				}
			}
		}

		startCommand = enet_list_next(currentCommand);
	}

	if (startCommand != currentCommand) {
		enet_list_move(enet_list_end(&peer->dispatchedCommands), startCommand, enet_list_previous(currentCommand));

		if (!peer->needsDispatch) {
			enet_list_insert(enet_list_end(&peer->host->dispatchQueue), &peer->dispatchList);

			peer->needsDispatch = 1;
		}

		droppedCommand = currentCommand;
	}

	enet_peer_remove_incoming_commands(&channel->incomingUnreliableCommands, enet_list_begin(&channel->incomingUnreliableCommands), droppedCommand, queuedCommand);
}